

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

char * i2s_ASN1_ENUMERATED(X509V3_EXT_METHOD *meth,ASN1_ENUMERATED *aint)

{
  BIGNUM *a;
  char *pcVar1;
  
  pcVar1 = (char *)0x0;
  if (aint != (ASN1_ENUMERATED *)0x0) {
    a = ASN1_ENUMERATED_to_BN(aint,(BIGNUM *)0x0);
    if (a != (BIGNUM *)0x0) {
      pcVar1 = bignum_to_string((BIGNUM *)a);
    }
    BN_free(a);
  }
  return pcVar1;
}

Assistant:

char *i2s_ASN1_ENUMERATED(const X509V3_EXT_METHOD *method,
                          const ASN1_ENUMERATED *a) {
  BIGNUM *bntmp = NULL;
  char *strtmp = NULL;
  if (!a) {
    return NULL;
  }
  if (!(bntmp = ASN1_ENUMERATED_to_BN(a, NULL)) ||
      !(strtmp = bignum_to_string(bntmp))) {
  }
  BN_free(bntmp);
  return strtmp;
}